

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_common.c
# Opt level: O1

int IoTHubTransport_AMQP_Common_Subscribe(IOTHUB_DEVICE_HANDLE handle)

{
  int iVar1;
  char *pcVar2;
  LIST_ITEM_HANDLE pLVar3;
  LOGGER_LOG p_Var4;
  int iVar5;
  
  if (handle == (IOTHUB_DEVICE_HANDLE)0x0) {
    p_Var4 = xlogging_get_log_function();
    iVar1 = 0x5f2;
    if (p_Var4 == (LOGGER_LOG)0x0) {
      return 0x5f2;
    }
    pcVar2 = "Invalid handle to IoTHubClient AMQP transport device handle.";
    iVar5 = 0x5f1;
  }
  else {
    pcVar2 = STRING_c_str(*handle);
    pLVar3 = singlylinkedlist_find
                       (*(SINGLYLINKEDLIST_HANDLE *)(*(long *)((long)handle + 0x10) + 0x28),
                        find_device_by_id_callback,pcVar2);
    if (pLVar3 == (LIST_ITEM_HANDLE)0x0) {
      STRING_c_str(*handle);
      p_Var4 = xlogging_get_log_function();
      iVar1 = 0x5fc;
      if (p_Var4 == (LOGGER_LOG)0x0) {
        return 0x5fc;
      }
      pcVar2 = 
      "Device \'%s\' failed subscribing to cloud-to-device messages (device is not registered)";
      iVar5 = 0x5fb;
    }
    else {
      iVar1 = amqp_device_subscribe_message
                        (*(AMQP_DEVICE_HANDLE *)((long)handle + 8),on_message_received,handle);
      if (iVar1 == 0) {
        return 0;
      }
      STRING_c_str(*handle);
      p_Var4 = xlogging_get_log_function();
      iVar1 = 0x602;
      if (p_Var4 == (LOGGER_LOG)0x0) {
        return 0x602;
      }
      pcVar2 = 
      "Device \'%s\' failed subscribing to cloud-to-device messages (amqp_device_subscribe_message failed)"
      ;
      iVar5 = 0x601;
    }
  }
  (*p_Var4)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_common.c"
            ,"IoTHubTransport_AMQP_Common_Subscribe",iVar5,1,pcVar2);
  return iVar1;
}

Assistant:

int IoTHubTransport_AMQP_Common_Subscribe(IOTHUB_DEVICE_HANDLE handle)
{
    int result;

    if (handle == NULL)
    {
        LogError("Invalid handle to IoTHubClient AMQP transport device handle.");
        result = MU_FAILURE;
    }
    else
    {
        AMQP_TRANSPORT_DEVICE_INSTANCE* amqp_device_instance = (AMQP_TRANSPORT_DEVICE_INSTANCE*)handle;

        if (!is_device_registered(amqp_device_instance))
        {
            const char* device_id = STRING_c_str(amqp_device_instance->device_id); // advoid MU_P_OR_NULL double call
            LogError("Device '%s' failed subscribing to cloud-to-device messages (device is not registered)", MU_P_OR_NULL(device_id));
            result = MU_FAILURE;
        }
        else if (amqp_device_subscribe_message(amqp_device_instance->device_handle, on_message_received, amqp_device_instance) != RESULT_OK)
        {
            const char* device_id = STRING_c_str(amqp_device_instance->device_id); // advoid MU_P_OR_NULL double call
            LogError("Device '%s' failed subscribing to cloud-to-device messages (amqp_device_subscribe_message failed)", MU_P_OR_NULL(device_id));
            result = MU_FAILURE;
        }
        else
        {
            result = RESULT_OK;
        }
    }

    return result;
}